

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void ARGBSepiaRow_SSSE3(uint8_t *dst_argb,int width)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  unkbyte9 Var17;
  unkbyte9 Var18;
  undefined6 uVar19;
  undefined4 uVar20;
  undefined2 uVar21;
  undefined6 uVar22;
  undefined4 uVar23;
  undefined2 uVar24;
  vec8 aiVar25;
  vec8 aiVar26;
  vec8 aiVar27;
  int iVar28;
  ushort uVar29;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar30 [16];
  ushort uVar39;
  undefined1 auVar31 [16];
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  int width_local;
  uint8_t *dst_argb_local;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  undefined1 auVar32 [16];
  
  aiVar27 = libyuv::kARGBToSepiaR;
  aiVar26 = libyuv::kARGBToSepiaG;
  aiVar25 = libyuv::kARGBToSepiaB;
  do {
    auVar30 = pmaddubsw(*(undefined1 (*) [16])dst_argb,(undefined1  [16])aiVar25);
    auVar48 = pmaddubsw(*(undefined1 (*) [16])((long)dst_argb + 0x10),(undefined1  [16])aiVar25);
    auVar30 = phaddw(auVar30,auVar48);
    uVar29 = auVar30._0_2_ >> 7;
    uVar33 = auVar30._2_2_ >> 7;
    uVar34 = auVar30._4_2_ >> 7;
    uVar35 = auVar30._6_2_ >> 7;
    uVar36 = auVar30._8_2_ >> 7;
    uVar37 = auVar30._10_2_ >> 7;
    uVar38 = auVar30._12_2_ >> 7;
    uVar39 = auVar30._14_2_ >> 7;
    cVar2 = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    auVar48 = pmaddubsw(*(undefined1 (*) [16])dst_argb,(undefined1  [16])aiVar26);
    auVar30 = pmaddubsw(*(undefined1 (*) [16])((long)dst_argb + 0x10),(undefined1  [16])aiVar26);
    auVar30 = phaddw(auVar48,auVar30);
    uVar39 = auVar30._0_2_ >> 7;
    uVar41 = auVar30._2_2_ >> 7;
    uVar42 = auVar30._4_2_ >> 7;
    uVar43 = auVar30._6_2_ >> 7;
    uVar44 = auVar30._8_2_ >> 7;
    uVar45 = auVar30._10_2_ >> 7;
    uVar46 = auVar30._12_2_ >> 7;
    uVar47 = auVar30._14_2_ >> 7;
    uVar21 = CONCAT11((uVar47 != 0) * (uVar47 < 0x100) * (char)uVar47 - (0xff < uVar47),cVar2);
    uVar20 = CONCAT31(CONCAT21(uVar21,(uVar46 != 0) * (uVar46 < 0x100) * (char)uVar46 -
                                      (0xff < uVar46)),
                      (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38));
    uVar19 = CONCAT51(CONCAT41(uVar20,(uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 -
                                      (0xff < uVar45)),
                      (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37));
    Var17 = CONCAT72(CONCAT61(uVar19,(uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 -
                                     (0xff < uVar44)),
                     CONCAT11((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                              cVar2));
    Var13 = CONCAT91(CONCAT81((long)((unkuint9)Var17 >> 8),
                              (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43)),
                     (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35));
    auVar12._2_10_ = Var13;
    auVar12[1] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
    auVar12[0] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    auVar11._2_12_ = auVar12;
    auVar11[1] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
    auVar11[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    auVar30._0_2_ =
         CONCAT11((uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39),
                  (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29));
    auVar30._2_14_ = auVar11;
    auVar40 = pmaddubsw(*(undefined1 (*) [16])dst_argb,(undefined1  [16])aiVar27);
    auVar48 = pmaddubsw(*(undefined1 (*) [16])((long)dst_argb + 0x10),(undefined1  [16])aiVar27);
    auVar48 = phaddw(auVar40,auVar48);
    uVar29 = auVar48._0_2_ >> 7;
    uVar33 = auVar48._2_2_ >> 7;
    uVar34 = auVar48._4_2_ >> 7;
    uVar35 = auVar48._6_2_ >> 7;
    uVar36 = auVar48._8_2_ >> 7;
    uVar37 = auVar48._10_2_ >> 7;
    uVar38 = auVar48._12_2_ >> 7;
    uVar39 = auVar48._14_2_ >> 7;
    cVar2 = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
    bVar3 = (*(undefined1 (*) [16])dst_argb)[3];
    bVar4 = (*(undefined1 (*) [16])dst_argb)[7];
    bVar5 = (*(undefined1 (*) [16])dst_argb)[0xb];
    bVar6 = (*(undefined1 (*) [16])dst_argb)[0xf];
    bVar7 = (*(undefined1 (*) [16])((long)dst_argb + 0x10))[3];
    bVar8 = (*(undefined1 (*) [16])((long)dst_argb + 0x10))[7];
    bVar9 = (*(undefined1 (*) [16])((long)dst_argb + 0x10))[0xb];
    bVar10 = (*(undefined1 (*) [16])((long)dst_argb + 0x10))[0xf];
    bVar3 = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    bVar4 = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    bVar5 = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    bVar6 = (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6);
    bVar7 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar8 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar9 = (bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9);
    bVar10 = (bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10);
    uVar24 = CONCAT11((bVar10 != 0) * (bVar10 < 0x100) * bVar10 - (0xff < bVar10),cVar2);
    uVar23 = CONCAT31(CONCAT21(uVar24,(bVar9 != 0) * (bVar9 < 0x100) * bVar9 - (0xff < bVar9)),
                      (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38));
    uVar22 = CONCAT51(CONCAT41(uVar23,(bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8)),
                      (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37));
    Var18 = CONCAT72(CONCAT61(uVar22,(bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7)),
                     CONCAT11((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36),
                              cVar2));
    Var16 = CONCAT91(CONCAT81((long)((unkuint9)Var18 >> 8),
                              (bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)),
                     (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35));
    auVar15._2_10_ = Var16;
    auVar15[1] = (bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5);
    auVar15[0] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    auVar14._2_12_ = auVar15;
    auVar14[1] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
    auVar14[0] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    auVar48[3] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
    auVar48[2] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    auVar32._0_12_ = auVar30._0_12_;
    auVar32._12_2_ = (short)Var13;
    auVar32._14_2_ = (short)Var16;
    auVar31._12_4_ = auVar32._12_4_;
    auVar31._0_10_ = auVar30._0_10_;
    auVar31._10_2_ = auVar15._0_2_;
    auVar40._10_6_ = auVar31._10_6_;
    auVar40._0_8_ = auVar30._0_8_;
    auVar40._8_2_ = auVar12._0_2_;
    auVar48._8_8_ = auVar40._8_8_;
    auVar48._6_2_ = auVar14._0_2_;
    auVar48._4_2_ = auVar11._0_2_;
    auVar48._0_2_ = auVar30._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar48;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var17 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var18 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar19;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)uVar22;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar20;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) = (short)uVar23;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar21;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = uVar24;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar28 = width + -8;
    bVar1 = 7 < width;
    width = iVar28;
  } while (iVar28 != 0 && bVar1);
  return;
}

Assistant:

void ARGBSepiaRow_SSSE3(uint8_t* dst_argb, int width) {
  asm volatile(
      "movdqa      %2,%%xmm2                     \n"
      "movdqa      %3,%%xmm3                     \n"
      "movdqa      %4,%%xmm4                     \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm6               \n"
      "pmaddubsw   %%xmm2,%%xmm0                 \n"
      "pmaddubsw   %%xmm2,%%xmm6                 \n"
      "phaddw      %%xmm6,%%xmm0                 \n"
      "psrlw       $0x7,%%xmm0                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movdqu      (%0),%%xmm5                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "pmaddubsw   %%xmm3,%%xmm5                 \n"
      "pmaddubsw   %%xmm3,%%xmm1                 \n"
      "phaddw      %%xmm1,%%xmm5                 \n"
      "psrlw       $0x7,%%xmm5                   \n"
      "packuswb    %%xmm5,%%xmm5                 \n"
      "punpcklbw   %%xmm5,%%xmm0                 \n"
      "movdqu      (%0),%%xmm5                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "pmaddubsw   %%xmm4,%%xmm5                 \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "phaddw      %%xmm1,%%xmm5                 \n"
      "psrlw       $0x7,%%xmm5                   \n"
      "packuswb    %%xmm5,%%xmm5                 \n"
      "movdqu      (%0),%%xmm6                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "psrld       $0x18,%%xmm6                  \n"
      "psrld       $0x18,%%xmm1                  \n"
      "packuswb    %%xmm1,%%xmm6                 \n"
      "packuswb    %%xmm6,%%xmm6                 \n"
      "punpcklbw   %%xmm6,%%xmm5                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklwd   %%xmm5,%%xmm0                 \n"
      "punpckhwd   %%xmm5,%%xmm1                 \n"
      "movdqu      %%xmm0,(%0)                   \n"
      "movdqu      %%xmm1,0x10(%0)               \n"
      "lea         0x20(%0),%0                   \n"
      "sub         $0x8,%1                       \n"
      "jg          1b                            \n"
      : "+r"(dst_argb),      // %0
        "+r"(width)          // %1
      : "m"(kARGBToSepiaB),  // %2
        "m"(kARGBToSepiaG),  // %3
        "m"(kARGBToSepiaR)   // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}